

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WindowCompare(Parse *pParse,Window *p1,Window *p2,int bFilter)

{
  int iVar1;
  int res;
  int bFilter_local;
  Window *p2_local;
  Window *p1_local;
  Parse *pParse_local;
  
  if ((p1 == (Window *)0x0) || (p2 == (Window *)0x0)) {
    pParse_local._4_4_ = 1;
  }
  else if (p1->eFrmType == p2->eFrmType) {
    if (p1->eStart == p2->eStart) {
      if (p1->eEnd == p2->eEnd) {
        if (p1->eExclude == p2->eExclude) {
          iVar1 = sqlite3ExprCompare(pParse,p1->pStart,p2->pStart,-1);
          if (iVar1 == 0) {
            iVar1 = sqlite3ExprCompare(pParse,p1->pEnd,p2->pEnd,-1);
            if (iVar1 == 0) {
              pParse_local._4_4_ = sqlite3ExprListCompare(p1->pPartition,p2->pPartition,-1);
              if (((pParse_local._4_4_ == 0) &&
                  (pParse_local._4_4_ = sqlite3ExprListCompare(p1->pOrderBy,p2->pOrderBy,-1),
                  pParse_local._4_4_ == 0)) &&
                 ((bFilter == 0 ||
                  (pParse_local._4_4_ = sqlite3ExprCompare(pParse,p1->pFilter,p2->pFilter,-1),
                  pParse_local._4_4_ == 0)))) {
                pParse_local._4_4_ = 0;
              }
            }
            else {
              pParse_local._4_4_ = 1;
            }
          }
          else {
            pParse_local._4_4_ = 1;
          }
        }
        else {
          pParse_local._4_4_ = 1;
        }
      }
      else {
        pParse_local._4_4_ = 1;
      }
    }
    else {
      pParse_local._4_4_ = 1;
    }
  }
  else {
    pParse_local._4_4_ = 1;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3WindowCompare(
  const Parse *pParse,
  const Window *p1,
  const Window *p2,
  int bFilter
){
  int res;
  if( NEVER(p1==0) || NEVER(p2==0) ) return 1;
  if( p1->eFrmType!=p2->eFrmType ) return 1;
  if( p1->eStart!=p2->eStart ) return 1;
  if( p1->eEnd!=p2->eEnd ) return 1;
  if( p1->eExclude!=p2->eExclude ) return 1;
  if( sqlite3ExprCompare(pParse, p1->pStart, p2->pStart, -1) ) return 1;
  if( sqlite3ExprCompare(pParse, p1->pEnd, p2->pEnd, -1) ) return 1;
  if( (res = sqlite3ExprListCompare(p1->pPartition, p2->pPartition, -1)) ){
    return res;
  }
  if( (res = sqlite3ExprListCompare(p1->pOrderBy, p2->pOrderBy, -1)) ){
    return res;
  }
  if( bFilter ){
    if( (res = sqlite3ExprCompare(pParse, p1->pFilter, p2->pFilter, -1)) ){
      return res;
    }
  }
  return 0;
}